

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedExe.cpp
# Opt level: O1

QString * __thiscall
ExeWrappersContainer::getWrapperName
          (QString *__return_storage_ptr__,ExeWrappersContainer *this,size_t id)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppEVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  QByteArrayView QVar5;
  size_t local_38;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  p_Var1 = &(this->wrappers)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->wrappers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < id]) {
    if (*(ulong *)(p_Var4 + 1) >= id) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, id < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  local_38 = id;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    QVar5.m_data = (storage_type *)0x0;
    QVar5.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar5);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    (__return_storage_ptr__->d).ptr = local_28;
    (__return_storage_ptr__->d).size = local_20;
  }
  else {
    ppEVar2 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&this->wrappers,&local_38);
    (*((*ppEVar2)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ExeWrappersContainer::getWrapperName(size_t id)
{
    if (wrappers.find(id) == wrappers.end()) return "";
    return wrappers[id]->getName();
}